

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O2

side_type helix::nasdaq::itch50_side(char c)

{
  side_type sVar1;
  invalid_argument *this;
  int __val;
  undefined7 in_register_00000039;
  allocator local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  sVar1 = buy;
  __val = (int)CONCAT71(in_register_00000039,c);
  if (__val != 0x42) {
    if (__val != 0x53) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_58,"invalid argument: ",&local_79);
      std::__cxx11::to_string(&local_78,__val);
      std::operator+(&local_38,&local_58,&local_78);
      std::invalid_argument::invalid_argument(this,(string *)&local_38);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    sVar1 = sell;
  }
  return sVar1;
}

Assistant:

static side_type itch50_side(char c)
{
    switch (c) {
    case 'B': return side_type::buy;
    case 'S': return side_type::sell;
    default:  throw std::invalid_argument(std::string("invalid argument: ") + std::to_string(c));
    }
}